

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionSkipBytes.cpp
# Opt level: O2

void __thiscall Hpipe::InstructionSkipBytes::get_code_repr(InstructionSkipBytes *this,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"SKIP_BYTES ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," ");
  std::operator<<(poVar1,(string *)&this->var);
  return;
}

Assistant:

void InstructionSkipBytes::get_code_repr( std::ostream &os ) {
    os << "SKIP_BYTES " << var.size() << " " << var;
}